

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

void pop_symbol_scope(Context_conflict *ctx,SymbolMap *map)

{
  SymbolScope *pSVar1;
  
  pSVar1 = map->scope;
  do {
    if (pSVar1 == (SymbolScope *)0x0) {
LAB_00142f27:
      __assert_fail("map->scope != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1e8,"void pop_symbol_scope(Context *, SymbolMap *)");
    }
    if (pSVar1->symbol == (char *)0x0) {
      if (pSVar1 != (SymbolScope *)0x0) {
        if (pSVar1->symbol == (char *)0x0) {
          pop_symbol(ctx,map);
          return;
        }
        __assert_fail("map->scope->symbol == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1e9,"void pop_symbol_scope(Context *, SymbolMap *)");
      }
      goto LAB_00142f27;
    }
    pop_symbol(ctx,map);
    pSVar1 = map->scope;
  } while( true );
}

Assistant:

static void pop_symbol_scope(Context *ctx, SymbolMap *map)
{
    while ((map->scope) && (map->scope->symbol))
        pop_symbol(ctx, map);

    assert(map->scope != NULL);
    assert(map->scope->symbol == NULL);
    pop_symbol(ctx, map);
}